

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  int *piVar2;
  int iVar3;
  bool bVar4;
  short sVar5;
  long lVar6;
  char cVar7;
  BYTE *s;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  long *plVar11;
  uint uVar12;
  int iVar13;
  ulong *puVar14;
  uint uVar15;
  ulong *puVar16;
  long *plVar17;
  long *plVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int *piVar22;
  int *piVar23;
  int *piVar24;
  long *plVar25;
  short *psVar26;
  char cVar27;
  short *__s;
  long *plVar28;
  short *psVar29;
  int *in_R8;
  ulong uVar30;
  ulong uVar31;
  char *pcVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  char *pcVar36;
  ulong uVar37;
  int iVar38;
  LZ4_stream_t ctxBody;
  long *local_40d0;
  uint local_4050 [4096];
  uint local_50;
  undefined4 local_4c;
  int local_38;
  
  iVar19 = 0;
  memset(local_4050,0,0x4020);
  uVar12 = *srcSizePtr;
  uVar37 = (ulong)uVar12;
  if (uVar37 < 0x7e000001) {
    iVar19 = (uint)(uVar37 * 0x8080808081 >> 0x27) + 0x10;
  }
  if (iVar19 <= targetDstSize) {
    iVar19 = LZ4_compress_fast_extState(local_4050,src,dst,uVar12,targetDstSize,1);
    return iVar19;
  }
  iVar19 = (int)dst;
  if ((int)uVar12 < 0x1000b) {
    if (0x7e000000 < uVar12) {
      return 0;
    }
    if (uVar37 == 0) {
      if (targetDstSize < 1) {
        return 0;
      }
      *dst = '\0';
      *srcSizePtr = 0;
      return 1;
    }
    if (targetDstSize < 1) {
      return 0;
    }
    local_38 = local_38 + uVar12;
    pcVar32 = dst + targetDstSize;
    local_4c = 3;
    piVar24 = (int *)src;
    uVar34 = uVar12 + local_50;
    if (0xc < (int)uVar12) {
      lVar20 = (long)src - (ulong)local_50;
      *(short *)((long)local_4050 + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) =
           (short)local_50;
      piVar23 = (int *)(src + 1);
      uVar34 = (uint)(*(int *)(src + 1) * -0x61c8864f) >> 0x13;
      psVar29 = (short *)dst;
      local_50 = uVar12 + local_50;
      do {
        uVar12 = 0x40;
        uVar15 = 1;
        do {
          piVar22 = piVar23;
          piVar23 = (int *)((ulong)uVar15 + (long)piVar22);
          sVar5 = (short)lVar20;
          if (src + (uVar37 - 0xb) < piVar23) {
            iVar35 = 2;
          }
          else {
            uVar21 = (ulong)*(ushort *)((long)local_4050 + (ulong)uVar34 * 2);
            iVar38 = *piVar23;
            *(short *)((long)local_4050 + (ulong)uVar34 * 2) = (short)piVar22 - sVar5;
            iVar35 = 7;
            if (*(int *)(lVar20 + uVar21) != *piVar22) {
              iVar35 = 0;
            }
            in_R8 = (int *)(uVar21 + lVar20);
            uVar34 = (uint)(iVar38 * -0x61c8864f) >> 0x13;
          }
          uVar15 = uVar12 >> 6;
          uVar12 = uVar12 + 1;
        } while (iVar35 == 0);
        if (iVar35 == 7) {
          iVar35 = 0;
        }
        piVar23 = piVar22;
        dst = (char *)psVar29;
        if (iVar35 == 0) {
          iVar35 = (int)piVar22 - (int)piVar24;
          lVar6 = 0;
          uVar12 = iVar35 - 0xfU;
          cVar7 = (char)piVar22 * '\x10' + (char)piVar24 * -0x10;
          do {
            cVar27 = cVar7;
            uVar15 = uVar12;
            lVar33 = lVar6;
            piVar2 = (int *)((long)in_R8 + lVar33);
            piVar23 = (int *)((long)piVar22 + lVar33);
            if ((piVar2 <= src) || (piVar23 <= piVar24)) break;
            lVar6 = lVar33 + -1;
            uVar12 = uVar15 - 1;
            cVar7 = cVar27 + -0x10;
          } while (*(char *)((long)piVar22 + lVar33 + -1) == *(char *)((long)in_R8 + lVar33 + -1));
          iVar38 = (int)lVar33;
          uVar21 = (ulong)(uint)(((int)piVar22 - (int)piVar24) + iVar38);
          pcVar36 = (char *)((long)psVar29 + uVar21 + (ulong)(iVar35 + iVar38 + 0xf0) / 0xff + 0xc);
          if (pcVar32 < pcVar36) {
            iVar35 = 2;
            psVar26 = psVar29;
          }
          else {
            __s = (short *)((long)psVar29 + 1);
            if ((uint)(iVar35 + iVar38) < 0xf) {
              *(char *)psVar29 = cVar27;
            }
            else {
              uVar8 = (ulong)(iVar35 - 0xfU) + lVar33;
              *(char *)psVar29 = -0x10;
              if (0xfe < (int)uVar8) {
                if (0x1fc < (int)uVar15) {
                  uVar15 = 0x1fd;
                }
                uVar12 = (iVar35 - uVar15) + iVar38 + 0xef;
                uVar8 = (ulong)uVar12 / 0xff;
                memset(__s,0xff,(ulong)(uVar12 / 0xff + 1));
                __s = (short *)((long)psVar29 + uVar8 + 2);
                uVar8 = (ulong)(uint)(iVar35 + -0x10e + iVar38 + (int)uVar8 * -0xff);
              }
              *(char *)__s = (char)uVar8;
              __s = (short *)((long)__s + 1);
            }
            psVar26 = (short *)(uVar21 + (long)__s);
            piVar9 = piVar24;
            do {
              *(undefined8 *)__s = *(undefined8 *)piVar9;
              __s = __s + 4;
              piVar9 = piVar9 + 2;
            } while (__s < psVar26);
            iVar35 = 0;
          }
          in_R8 = piVar2;
          dst = (char *)psVar26;
          if (pcVar36 <= pcVar32) {
            iVar35 = 2;
            do {
              dst = (char *)psVar29;
              if (pcVar32 < (char *)((long)psVar26 + 0xb)) goto LAB_0010ea88;
              *psVar26 = (short)piVar23 - (short)in_R8;
              puVar1 = (ulong *)(piVar23 + 1);
              puVar16 = (ulong *)(in_R8 + 1);
              puVar14 = puVar1;
              if (puVar1 < src + (uVar37 - 0xc)) {
                uVar8 = *(ulong *)(piVar23 + 1) ^ *(ulong *)(in_R8 + 1);
                uVar21 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar21 = uVar21 >> 3 & 0x1fffffff;
                puVar14 = (ulong *)(piVar23 + 3);
                puVar16 = (ulong *)(in_R8 + 3);
                if (*(ulong *)(in_R8 + 1) == *(ulong *)(piVar23 + 1)) goto LAB_0010e818;
              }
              else {
LAB_0010e818:
                do {
                  if (src + (uVar37 - 0xc) <= puVar14) {
                    if ((puVar14 < src + (uVar37 - 8)) && ((int)*puVar16 == (int)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 4);
                      puVar16 = (ulong *)((long)puVar16 + 4);
                    }
                    if ((puVar14 < src + (uVar37 - 6)) && ((short)*puVar16 == (short)*puVar14)) {
                      puVar14 = (ulong *)((long)puVar14 + 2);
                      puVar16 = (ulong *)((long)puVar16 + 2);
                    }
                    if (puVar14 < src + (uVar37 - 5)) {
                      puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar16 == (char)*puVar14))
                      ;
                    }
                    uVar21 = (ulong)(uint)((int)puVar14 - (int)puVar1);
                    goto LAB_0010e855;
                  }
                  uVar21 = *puVar16;
                  uVar8 = *puVar14;
                  uVar30 = uVar8 ^ uVar21;
                  uVar10 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  iVar38 = (int)puVar14;
                  puVar16 = puVar16 + 1;
                  puVar14 = puVar14 + 1;
                } while (uVar21 == uVar8);
                uVar21 = (ulong)((((uint)(uVar10 >> 3) & 0x1fffffff) + iVar38) - (int)puVar1);
              }
LAB_0010e855:
              dst = (char *)(psVar26 + 1);
              uVar12 = (uint)uVar21;
              piVar24 = (int *)((long)piVar23 + uVar21 + 4);
              if (pcVar32 < (char *)((long)psVar26 + (ulong)(uVar12 + 0xf0) / 0xff + 8)) {
                uVar15 = ((int)pcVar32 - (int)dst) * 0xff - 0x5ec;
                piVar24 = (int *)((long)piVar24 - (ulong)(uVar12 - uVar15));
                for (piVar23 = piVar24; uVar12 = uVar15, piVar23 <= piVar22;
                    piVar23 = (int *)((long)piVar23 + 1)) {
                  *(undefined2 *)
                   ((long)local_4050 + (ulong)((uint)(*piVar23 * -0x61c8864f) >> 0x13) * 2) = 0;
                }
              }
              if (uVar12 < 0xf) {
                *(char *)psVar29 = (char)*psVar29 + (char)uVar12;
              }
              else {
                *(char *)psVar29 = (char)*psVar29 + '\x0f';
                uVar15 = uVar12 - 0xf;
                *(short *)((long)dst + 0) = -1;
                *(short *)((long)dst + 2) = -1;
                if (0x3fb < uVar15) {
                  uVar12 = uVar12 - 0x40b;
                  memset(psVar26 + 3,0xff,(ulong)((uVar12 / 0x3fc) * 4 + 4));
                  uVar15 = uVar12 % 0x3fc;
                  dst = (char *)((long)psVar26 + (ulong)((uVar12 / 0x3fc) * 4) + 6);
                }
                pcVar36 = (char *)((long)dst + (ulong)uVar15 / 0xff);
                dst = pcVar36 + 1;
                *pcVar36 = (char)((ulong)uVar15 * 0x8080808081 >> 0x27);
              }
              piVar23 = piVar24;
              if (src + (uVar37 - 0xb) <= piVar24) {
                iVar35 = 3;
                goto LAB_0010ea88;
              }
              *(short *)((long)local_4050 +
                        (ulong)((uint)(*(int *)((long)piVar24 + -2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)piVar24 + -2) - sVar5;
              uVar21 = (ulong)((uint)(*piVar24 * -0x61c8864f) >> 0x13);
              uVar8 = (ulong)*(ushort *)((long)local_4050 + uVar21 * 2);
              *(short *)((long)local_4050 + uVar21 * 2) = (short)piVar24 - sVar5;
              iVar38 = *(int *)(lVar20 + uVar8);
              iVar13 = *piVar24;
              psVar26 = (short *)dst;
              if (iVar38 == iVar13) {
                *dst = '\0';
                psVar26 = (short *)((long)dst + 1);
                psVar29 = (short *)dst;
              }
              in_R8 = (int *)(uVar8 + lVar20);
            } while (iVar38 == iVar13);
            uVar34 = (uint)(*(int *)((long)piVar24 + 1) * -0x61c8864f) >> 0x13;
            iVar35 = 0;
            piVar23 = (int *)((long)piVar24 + 1);
            dst = (char *)psVar26;
          }
        }
LAB_0010ea88:
        psVar29 = (short *)dst;
      } while (iVar35 == 0);
      uVar34 = local_50;
      if (1 < iVar35 - 2U) goto LAB_0010f34c;
    }
    local_50 = uVar34;
    pcVar36 = src + (uVar37 - (long)piVar24);
    if (pcVar32 < (char *)((long)dst + (long)(pcVar36 + (ulong)(pcVar36 + 0xf0) / 0xff + 1))) {
      pcVar36 = pcVar32 + (~(ulong)dst - ((ulong)(pcVar32 + ~(ulong)dst + 0xf1) >> 8));
    }
    if (pcVar36 < (char *)0xf) {
      *dst = (char)pcVar36 << 4;
    }
    else {
      pcVar32 = pcVar36 + -0xf;
      *dst = -0x10;
      psVar29 = (short *)((long)dst + 1);
      if ((char *)0xfe < pcVar32) {
        uVar37 = (ulong)(pcVar36 + -0x10e) / 0xff;
        memset(psVar29,0xff,uVar37 + 1);
        psVar29 = (short *)((long)dst + uVar37 + 2);
        pcVar32 = pcVar36 + uVar37 * -0xff + -0x10e;
      }
      *(char *)psVar29 = (char)pcVar32;
      dst = (char *)psVar29;
    }
    memcpy((char *)((long)dst + 1),piVar24,(size_t)pcVar36);
    *srcSizePtr = ((int)piVar24 + (int)pcVar36) - (int)src;
    iVar19 = ((int)(char *)((long)dst + 1) + (int)pcVar36) - iVar19;
  }
  else {
    if (0x7e000000 < uVar12) {
      return 0;
    }
    if (targetDstSize < 1) {
      return 0;
    }
    lVar20 = (long)src - (ulong)local_50;
    local_38 = local_38 + uVar12;
    pcVar32 = dst + targetDstSize;
    local_4c = 2;
    local_4050[(ulong)(*(long *)src * -0x30e4432345000000) >> 0x34] = local_50;
    plVar17 = (long *)(src + 1);
    uVar21 = (ulong)(*(long *)(src + 1) * -0x30e4432345000000) >> 0x34;
    local_40d0 = (long *)src;
    local_50 = uVar12 + local_50;
    do {
      uVar12 = 0x40;
      uVar8 = 1;
      plVar25 = plVar17;
      while( true ) {
        plVar17 = (long *)(uVar8 + (long)plVar25);
        iVar35 = (int)plVar25;
        iVar38 = (int)lVar20;
        if (src + (uVar37 - 0xb) < plVar17) {
          iVar13 = 2;
        }
        else {
          uVar34 = local_4050[uVar21];
          in_R8 = (int *)((ulong)uVar34 + lVar20);
          uVar8 = (ulong)(*plVar17 * -0x30e4432345000000) >> 0x34;
          local_4050[uVar21] = iVar35 - iVar38;
          iVar13 = 8;
          uVar21 = uVar8;
          if (((uint)(iVar35 - iVar38) <= uVar34 + 0xffff) && (iVar13 = 7, *in_R8 != (int)*plVar25))
          {
            iVar13 = 0;
          }
        }
        if ((iVar13 != 0) && (iVar13 != 8)) break;
        uVar8 = (ulong)(uVar12 >> 6);
        uVar12 = uVar12 + 1;
        plVar25 = plVar17;
      }
      if (iVar13 == 7) {
        iVar13 = 0;
      }
      plVar28 = (long *)dst;
      plVar17 = plVar25;
      if (iVar13 == 0) {
        iVar13 = iVar35 - (int)local_40d0;
        lVar6 = 0;
        uVar12 = iVar13 - 0xfU;
        cVar7 = (char)plVar25 * '\x10' + (char)local_40d0 * -0x10;
        do {
          cVar27 = cVar7;
          uVar34 = uVar12;
          lVar33 = lVar6;
          piVar24 = (int *)((long)in_R8 + lVar33);
          plVar17 = (long *)(lVar33 + (long)plVar25);
          if ((piVar24 <= src) || (plVar17 <= local_40d0)) break;
          lVar6 = lVar33 + -1;
          uVar12 = uVar34 - 1;
          cVar7 = cVar27 + -0x10;
        } while (*(char *)((long)plVar25 + lVar33 + -1) == *(char *)((long)in_R8 + lVar33 + -1));
        iVar3 = (int)lVar33;
        uVar8 = (ulong)(uint)(iVar3 + (iVar35 - (int)local_40d0));
        pcVar36 = (char *)((long)dst + uVar8 + (ulong)(iVar13 + iVar3 + 0xf0) / 0xff + 0xc);
        if (pcVar32 < pcVar36) {
          iVar13 = 2;
          plVar18 = (long *)dst;
        }
        else {
          plVar28 = (long *)((long)dst + 1);
          if ((uint)(iVar13 + iVar3) < 0xf) {
            *dst = cVar27;
          }
          else {
            uVar10 = (ulong)(iVar13 - 0xfU) + lVar33;
            *dst = -0x10;
            if (0xfe < (int)uVar10) {
              if (0x1fc < (int)uVar34) {
                uVar34 = 0x1fd;
              }
              uVar12 = (iVar13 - uVar34) + iVar3 + 0xef;
              uVar10 = (ulong)uVar12 / 0xff;
              memset(plVar28,0xff,(ulong)(uVar12 / 0xff + 1));
              plVar28 = (long *)((long)dst + uVar10 + 2);
              uVar10 = (ulong)(uint)(iVar13 + -0x10e + iVar3 + (int)uVar10 * -0xff);
            }
            *(char *)plVar28 = (char)uVar10;
            plVar28 = (long *)((long)plVar28 + 1);
          }
          plVar18 = (long *)(uVar8 + (long)plVar28);
          plVar11 = local_40d0;
          do {
            *plVar28 = *plVar11;
            plVar28 = plVar28 + 1;
            plVar11 = plVar11 + 1;
          } while (plVar28 < plVar18);
          iVar13 = 0;
        }
        in_R8 = piVar24;
        plVar28 = plVar18;
        if (pcVar36 <= pcVar32) {
          iVar13 = 2;
          do {
            plVar28 = (long *)dst;
            if (pcVar32 < (char *)((long)plVar18 + 0xb)) goto LAB_0010f0fe;
            *(short *)plVar18 = (short)plVar17 - (short)in_R8;
            puVar1 = (ulong *)((long)plVar17 + 4);
            puVar16 = (ulong *)(in_R8 + 1);
            puVar14 = puVar1;
            if (puVar1 < src + (uVar37 - 0xc)) {
              uVar10 = *(ulong *)((long)plVar17 + 4) ^ *(ulong *)(in_R8 + 1);
              uVar8 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                }
              }
              uVar8 = uVar8 >> 3 & 0x1fffffff;
              puVar14 = (ulong *)((long)plVar17 + 0xc);
              puVar16 = (ulong *)(in_R8 + 3);
              if (*(ulong *)(in_R8 + 1) == *(ulong *)((long)plVar17 + 4)) goto LAB_0010ee4b;
            }
            else {
LAB_0010ee4b:
              do {
                if (src + (uVar37 - 0xc) <= puVar14) {
                  if ((puVar14 < src + (uVar37 - 8)) && ((int)*puVar16 == (int)*puVar14)) {
                    puVar14 = (ulong *)((long)puVar14 + 4);
                    puVar16 = (ulong *)((long)puVar16 + 4);
                  }
                  if ((puVar14 < src + (uVar37 - 6)) && ((short)*puVar16 == (short)*puVar14)) {
                    puVar14 = (ulong *)((long)puVar14 + 2);
                    puVar16 = (ulong *)((long)puVar16 + 2);
                  }
                  if (puVar14 < src + (uVar37 - 5)) {
                    puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar16 == (char)*puVar14));
                  }
                  uVar8 = (ulong)(uint)((int)puVar14 - (int)puVar1);
                  goto LAB_0010ee88;
                }
                uVar8 = *puVar16;
                uVar10 = *puVar14;
                uVar31 = uVar10 ^ uVar8;
                uVar30 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                iVar35 = (int)puVar14;
                puVar16 = puVar16 + 1;
                puVar14 = puVar14 + 1;
              } while (uVar8 == uVar10);
              uVar8 = (ulong)((((uint)(uVar30 >> 3) & 0x1fffffff) + iVar35) - (int)puVar1);
            }
LAB_0010ee88:
            plVar28 = (long *)((long)plVar18 + 2);
            uVar12 = (uint)uVar8;
            local_40d0 = (long *)((long)plVar17 + uVar8 + 4);
            if (pcVar32 < (char *)((long)plVar18 + (ulong)(uVar12 + 0xf0) / 0xff + 8)) {
              uVar34 = ((int)pcVar32 - (int)plVar28) * 0xff - 0x5ec;
              local_40d0 = (long *)((long)local_40d0 - (ulong)(uVar12 - uVar34));
              for (plVar17 = local_40d0; uVar12 = uVar34, plVar17 <= plVar25;
                  plVar17 = (long *)((long)plVar17 + 1)) {
                local_4050[(ulong)(*plVar17 * -0x30e4432345000000) >> 0x34] = 0;
              }
            }
            if (uVar12 < 0xf) {
              *dst = (char)*(long *)dst + (char)uVar12;
            }
            else {
              *dst = (char)*(long *)dst + '\x0f';
              uVar34 = uVar12 - 0xf;
              *(undefined4 *)plVar28 = 0xffffffff;
              if (0x3fb < uVar34) {
                uVar12 = uVar12 - 0x40b;
                memset((char *)((long)plVar18 + 6),0xff,(ulong)((uVar12 / 0x3fc) * 4 + 4));
                uVar34 = uVar12 % 0x3fc;
                plVar28 = (long *)((long)plVar18 + (ulong)((uVar12 / 0x3fc) * 4) + 6);
              }
              pcVar36 = (char *)((long)plVar28 + (ulong)uVar34 / 0xff);
              plVar28 = (long *)(pcVar36 + 1);
              *pcVar36 = (char)((ulong)uVar34 * 0x8080808081 >> 0x27);
            }
            plVar17 = local_40d0;
            if (src + (uVar37 - 0xb) <= local_40d0) {
              iVar13 = 3;
              goto LAB_0010f0fe;
            }
            local_4050[(ulong)(*(long *)((long)local_40d0 + -2) * -0x30e4432345000000) >> 0x34] =
                 ((int)local_40d0 + -2) - iVar38;
            uVar8 = (ulong)(*local_40d0 * -0x30e4432345000000) >> 0x34;
            uVar34 = (int)local_40d0 - iVar38;
            uVar12 = local_4050[uVar8];
            in_R8 = (int *)((ulong)uVar12 + lVar20);
            local_4050[uVar8] = uVar34;
            bVar4 = true;
            plVar18 = plVar28;
            if ((uVar34 <= uVar12 + 0xffff) && (*in_R8 == (int)*local_40d0)) {
              *(char *)plVar28 = '\0';
              bVar4 = false;
              plVar18 = (long *)((long)plVar28 + 1);
              dst = (char *)plVar28;
            }
          } while (!bVar4);
          uVar21 = (ulong)(*(long *)((long)local_40d0 + 1) * -0x30e4432345000000) >> 0x34;
          iVar13 = 0;
          plVar28 = plVar18;
          plVar17 = (long *)((long)local_40d0 + 1);
        }
      }
LAB_0010f0fe:
      dst = (char *)plVar28;
    } while (iVar13 == 0);
    if (iVar13 - 2U < 2) {
      pcVar36 = src + (uVar37 - (long)local_40d0);
      if (pcVar32 < (char *)((long)plVar28 + (long)(pcVar36 + (ulong)(pcVar36 + 0xf0) / 0xff + 1)))
      {
        pcVar36 = pcVar32 + (~(ulong)plVar28 - ((ulong)(pcVar32 + ~(ulong)plVar28 + 0xf1) >> 8));
      }
      if (pcVar36 < (char *)0xf) {
        *(char *)plVar28 = (char)pcVar36 << 4;
      }
      else {
        pcVar32 = pcVar36 + -0xf;
        *(char *)plVar28 = -0x10;
        plVar17 = (long *)((long)plVar28 + 1);
        if ((char *)0xfe < pcVar32) {
          uVar37 = (ulong)(pcVar36 + -0x10e) / 0xff;
          memset(plVar17,0xff,uVar37 + 1);
          plVar17 = (long *)((long)plVar28 + uVar37 + 2);
          pcVar32 = pcVar36 + uVar37 * -0xff + -0x10e;
        }
        *(char *)plVar17 = (char)pcVar32;
        plVar28 = plVar17;
      }
      memcpy((char *)((long)plVar28 + 1),local_40d0,(size_t)pcVar36);
      *srcSizePtr = ((int)local_40d0 + (int)pcVar36) - (int)src;
      return ((int)(char *)((long)plVar28 + 1) + (int)pcVar36) - iVar19;
    }
LAB_0010f34c:
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}